

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *dtName,bool heap)

{
  DOMNode *pDVar1;
  code *pcVar2;
  short *psVar3;
  short *psVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNamedNodeMapImpl *pDVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar10;
  undefined8 *puVar11;
  long *plVar12;
  DOMNode *ownerNode;
  XMLCh *pXVar13;
  _func_int **pp_Var14;
  long *plVar15;
  XMLCh XVar16;
  _func_int *p_Var17;
  long lVar18;
  _func_int **pp_Var19;
  undefined8 *puVar20;
  XMLMutexLock lock;
  XMLMutexLock local_50;
  DOMChildNode *local_48;
  DOMParentNode *local_40;
  DOMNodeImpl *local_38;
  _func_int *p_Var8;
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404248;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404428;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404458;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404488;
  pDVar1 = &ownerDoc->super_DOMNode;
  ownerNode = pDVar1;
  if (ownerDoc == (DOMDocument *)0x0) {
    ownerNode = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,ownerNode);
  local_40 = &this->fParent;
  local_38 = &this->fNode;
  DOMParentNode::DOMParentNode(local_40,(DOMNode *)this,ownerDoc);
  local_48 = &this->fChild;
  DOMChildNode::DOMChildNode(local_48);
  *(undefined8 *)((long)&this->fSystemId + 1) = 0;
  *(undefined8 *)((long)&this->fInternalSubset + 1) = 0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fIsCreatedFromHeap = heap;
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock(&local_50,sDocumentMutex);
    lVar7 = sDocument;
    if (dtName == (XMLCh *)0x0) {
      pXVar13 = (XMLCh *)0x0;
    }
    else {
      lVar18 = 0;
      do {
        psVar3 = (short *)((long)dtName + lVar18);
        lVar18 = lVar18 + 2;
      } while (*psVar3 != 0);
      uVar6 = (ulong)(ushort)*dtName;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        XVar16 = dtName[1];
        if (XVar16 != L'\0') {
          pXVar13 = dtName + 2;
          do {
            uVar6 = (ulong)(ushort)XVar16 + (uVar6 >> 0x18) + uVar6 * 0x26;
            XVar16 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar16 != L'\0');
        }
        uVar6 = uVar6 % *(ulong *)(sDocument + 0x138);
      }
      lVar18 = (lVar18 >> 1) + -1;
      puVar11 = *(undefined8 **)(*(long *)(sDocument + 0x130) + uVar6 * 8);
      if (puVar11 == (undefined8 *)0x0) {
        puVar20 = (undefined8 *)(*(long *)(sDocument + 0x130) + uVar6 * 8);
      }
      else {
        do {
          puVar20 = puVar11;
          if (puVar20[1] == lVar18) {
            pXVar13 = (XMLCh *)(puVar20 + 2);
            if (pXVar13 == dtName) goto LAB_00267fce;
            lVar10 = 0;
            do {
              psVar3 = (short *)((long)pXVar13 + lVar10);
              if (*psVar3 == 0) {
                if (*(short *)((long)dtName + lVar10) == 0) goto LAB_00267fce;
                break;
              }
              psVar4 = (short *)((long)dtName + lVar10);
              lVar10 = lVar10 + 2;
            } while (*psVar3 == *psVar4);
          }
          puVar11 = (undefined8 *)*puVar20;
        } while ((undefined8 *)*puVar20 != (undefined8 *)0x0);
      }
      puVar11 = (undefined8 *)
                (**(code **)(*(long *)(sDocument + -8) + 0x20))
                          ((long *)(sDocument + -8),lVar18 * 2 + 0x18);
      *puVar20 = puVar11;
      puVar11[1] = lVar18;
      *puVar11 = 0;
      pXVar13 = (XMLCh *)(puVar11 + 2);
      XMLString::copyString(pXVar13,dtName);
    }
LAB_00267fce:
    this->fName = pXVar13;
    plVar15 = (long *)(lVar7 + 0x18);
    plVar12 = (long *)(**(code **)(*(long *)(lVar7 + 0x18) + 0x130))
                                (plVar15,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar12 + 0x20))(plVar12,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fEntities = pDVar9;
    plVar12 = (long *)(**(code **)(*plVar15 + 0x130))
                                (plVar15,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar12 + 0x20))(plVar12,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fNotations = pDVar9;
    plVar12 = (long *)(**(code **)(*plVar15 + 0x130))
                                (plVar15,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar12 + 0x20))(plVar12,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fElements = pDVar9;
    XMLMutexLock::~XMLMutexLock(&local_50);
  }
  else {
    if (dtName == (XMLCh *)0x0) {
      pp_Var14 = (_func_int **)0x0;
    }
    else {
      lVar7 = 0;
      do {
        psVar3 = (short *)((long)dtName + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar3 != 0);
      uVar6 = (ulong)(ushort)*dtName;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        XVar16 = dtName[1];
        if (XVar16 != L'\0') {
          pXVar13 = dtName + 2;
          do {
            uVar6 = (ulong)(ushort)XVar16 + (uVar6 >> 0x18) + uVar6 * 0x26;
            XVar16 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar16 != L'\0');
        }
        uVar6 = uVar6 % (ulong)ownerDoc[9].super_DOMNode._vptr_DOMNode;
      }
      p_Var17 = (_func_int *)((lVar7 >> 1) + -1);
      pp_Var19 = ownerDoc[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
      pp_Var14 = (_func_int **)pp_Var19[uVar6];
      if (pp_Var14 == (_func_int **)0x0) {
        pp_Var19 = pp_Var19 + uVar6;
      }
      else {
        do {
          pp_Var19 = pp_Var14;
          if (pp_Var19[1] == p_Var17) {
            pp_Var14 = pp_Var19 + 2;
            if (pp_Var14 == (_func_int **)dtName) goto LAB_00267e82;
            lVar7 = 0;
            do {
              pcVar2 = (code *)((long)pp_Var14 + lVar7);
              if (*(short *)pcVar2 == 0) {
                if (*(short *)((long)dtName + lVar7) == 0) goto LAB_00267e82;
                break;
              }
              psVar3 = (short *)((long)dtName + lVar7);
              lVar7 = lVar7 + 2;
            } while (*(short *)pcVar2 == *psVar3);
          }
          pp_Var14 = (_func_int **)*pp_Var19;
        } while ((_func_int **)*pp_Var19 != (_func_int **)0x0);
      }
      iVar5 = (*ownerDoc[-1].super_DOMNode._vptr_DOMNode[4])
                        (&ownerDoc[-1].super_DOMNode,(long)p_Var17 * 2 + 0x18);
      p_Var8 = (_func_int *)CONCAT44(extraout_var,iVar5);
      *pp_Var19 = p_Var8;
      *(_func_int **)(p_Var8 + 8) = p_Var17;
      *(undefined8 *)p_Var8 = 0;
      pp_Var14 = (_func_int **)(p_Var8 + 0x10);
      XMLString::copyString((XMLCh *)pp_Var14,dtName);
    }
LAB_00267e82:
    this->fName = (XMLCh *)pp_Var14;
    iVar5 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar5),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fEntities = pDVar9;
    iVar5 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x20))
                       ((long *)CONCAT44(extraout_var_01,iVar5),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fNotations = pDVar9;
    iVar5 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar9 = (DOMNamedNodeMapImpl *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x20))
                       ((long *)CONCAT44(extraout_var_02,iVar5),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fElements = pDVar9;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *dtName,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    if (ownerDoc)
    {
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(dtName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fName = ((DOMDocumentImpl *)doc)->getPooledString(dtName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}